

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O2

BlowfishContext * bcrypt_setup(uchar *key,int keybytes,uchar *salt,int saltbytes)

{
  BlowfishContext *ctx;
  int iVar1;
  bool bVar2;
  
  ctx = blowfish_make_context();
  blowfish_initkey(ctx);
  blowfish_expandkey(ctx,key,(short)keybytes,salt,(short)saltbytes);
  iVar1 = 0x40;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    blowfish_expandkey(ctx,salt,(short)saltbytes,(void *)0x0,0);
    blowfish_expandkey(ctx,key,(short)keybytes,(void *)0x0,0);
  }
  return ctx;
}

Assistant:

BlowfishContext *bcrypt_setup(const unsigned char *key, int keybytes,
                              const unsigned char *salt, int saltbytes)
{
    int i;
    BlowfishContext *ctx;

    ctx = blowfish_make_context();
    blowfish_initkey(ctx);
    blowfish_expandkey(ctx, key, keybytes, salt, saltbytes);

    /* Original bcrypt replaces this fixed loop count with the
     * variable cost. OpenSSH instead iterates the whole thing more
     * than once if it wants extra rounds. */
    for (i = 0; i < 64; i++) {
        blowfish_expandkey(ctx, salt, saltbytes, NULL, 0);
        blowfish_expandkey(ctx, key, keybytes, NULL, 0);
    }

    return ctx;
}